

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O0

QList<QModelIndex> * __thiscall
QListViewPrivate::intersectingSet(QListViewPrivate *this,QRect *area,bool doLayout)

{
  bool bVar1;
  byte in_CL;
  QRect *in_RDX;
  QListViewPrivate *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect a;
  QAbstractItemViewPrivate *pQVar2;
  QListViewPrivate *this_00;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  this_00 = in_RSI;
  if ((in_CL & 1) != 0) {
    QAbstractItemViewPrivate::executePostedLayout(in_RDI);
  }
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  q_func(in_RSI);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x88a96f);
  if (bVar1) {
    QRect::normalized();
    local_18 = (undefined1  [16])flipX(this_00,in_RDX);
  }
  else {
    local_18 = QRect::normalized();
  }
  (*in_RSI->commonListView->_vptr_QCommonListViewBase[7])(pQVar2,in_RSI->commonListView,local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QModelIndex> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<QModelIndex> intersectingSet(const QRect &area, bool doLayout = true) const
    {
        if (doLayout) executePostedLayout();
        QRect a = (q_func()->isRightToLeft() ? flipX(area.normalized()) : area.normalized());
        return commonListView->intersectingSet(a);
    }